

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall BitSet::toArray(BitSet *this)

{
  const_reference cVar1;
  size_type_conflict sVar2;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  uint i;
  vector<int,_std::allocator<int>_> *elems;
  value_type_conflict1 *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined4 local_18;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  this_00 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x28fc1f);
  for (local_18 = 0; sVar2 = std::vector<bool,_std::allocator<bool>_>::size(this_00),
      local_18 < sVar2; local_18 = local_18 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RSI,(size_type_conflict)in_RDI);
    if (cVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT17(cVar1,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<int> BitSet::toArray() const
{
	std::vector<int> elems;
	for (unsigned int i=0;i<storage.size();i++) {
		if (storage[i])
			elems.push_back(i);
	}

	return elems;
}